

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall
MyPlanner::MyPlanner
          (MyPlanner *this,string *lower_bound_str,string *base_lower_bound_str,
          string *upper_bound_str,string *base_upper_bound_str)

{
  pointer pcVar1;
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  pcVar1 = (lower_bound_str->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + lower_bound_str->_M_string_length);
  pcVar1 = (base_lower_bound_str->_M_dataplus)._M_p;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar1,pcVar1 + base_lower_bound_str->_M_string_length);
  pcVar1 = (upper_bound_str->_M_dataplus)._M_p;
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,pcVar1,pcVar1 + upper_bound_str->_M_string_length);
  pcVar1 = (base_lower_bound_str->_M_dataplus)._M_p;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,pcVar1,pcVar1 + base_lower_bound_str->_M_string_length);
  despot::Planner::Planner(&this->super_Planner,local_50,local_70,local_90,local_b0);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  *(undefined ***)this = &PTR__Planner_0011fcd8;
  return;
}

Assistant:

MyPlanner(string lower_bound_str,
			string base_lower_bound_str,
			string upper_bound_str,
			string base_upper_bound_str) : Planner(lower_bound_str,
				base_lower_bound_str,
				upper_bound_str,
				base_lower_bound_str) {
  }